

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::synchronization_internal::KernelTimeout::KernelTimeout
          (KernelTimeout *this,Duration d)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  HiRep HVar4;
  int64_t iVar5;
  uint64_t uVar6;
  Duration local_30;
  
  uVar3 = d.rep_lo_;
  HVar4 = d.rep_hi_;
  uVar6 = 0xffffffffffffffff;
  if (HVar4 != (HiRep)0x7fffffffffffffff || uVar3 != 0xffffffff) {
    if ((ulong)HVar4 >> 0x21 == 0) {
      iVar5 = (ulong)(uVar3 >> 2) + (long)HVar4 * 1000000000;
    }
    else {
      local_30.rep_hi_ = HVar4;
      local_30.rep_lo_ = uVar3;
      iVar5 = IDivDuration(d,(Duration)(ZEXT412(4) << 0x40),&local_30);
    }
    lVar1 = std::chrono::_V2::steady_clock::now();
    if (iVar5 <= 0x7fffffffffffffff - lVar1) {
      lVar2 = 0;
      if (0 < iVar5) {
        lVar2 = iVar5;
      }
      uVar6 = (lVar2 + lVar1) * 2 + 1;
    }
  }
  this->rep_ = uVar6;
  return;
}

Assistant:

KernelTimeout::KernelTimeout(absl::Duration d) {
  // `absl::InfiniteDuration()` is a common "no timeout" value and cheaper to
  // compare than convert.
  if (d == absl::InfiniteDuration()) {
    rep_ = kNoTimeout;
    return;
  }

  int64_t nanos = absl::ToInt64Nanoseconds(d);

  // Negative durations are normalized to 0.
  // In theory implementations should expire these timeouts immediately.
  if (nanos < 0) {
    nanos = 0;
  }

  int64_t now = SteadyClockNow();
  if (nanos > kMaxNanos - now) {
    // Durations that would be greater than kMaxNanos are converted to infinite.
    rep_ = kNoTimeout;
    return;
  }

  nanos += now;
  rep_ = (static_cast<uint64_t>(nanos) << 1) | uint64_t{1};
}